

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O1

MaybeResult<wasm::Type> *
wasm::WATParser::tupletype<wasm::WATParser::ParseTypeDefsCtx>
          (MaybeResult<wasm::Type> *__return_storage_ptr__,ParseTypeDefsCtx *ctx)

{
  undefined8 *puVar1;
  _Uninitialized<wasm::Type,_true> _Var2;
  undefined1 uVar3;
  pointer pTVar4;
  bool bVar5;
  Type TVar6;
  ulong uVar7;
  string_view expected;
  undefined1 local_110 [8];
  Result<wasm::Type> _val;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  undefined1 local_c8 [8];
  Result<wasm::Type> elem;
  long local_90;
  undefined1 *local_88;
  uintptr_t local_80;
  undefined1 local_78;
  undefined7 uStack_77;
  undefined8 uStack_70;
  Lexer *local_68;
  ParseTypeDefsCtx *local_60;
  undefined1 auStack_58 [8];
  vector<wasm::Type,_std::allocator<wasm::Type>_> elems;
  
  local_68 = &ctx->in;
  expected._M_str = "tuple";
  expected._M_len = 5;
  local_60 = ctx;
  bVar5 = Lexer::takeSExprStart(local_68,expected);
  if (bVar5) {
    auStack_58 = (undefined1  [8])0x0;
    elems.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    elems.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    puVar1 = (undefined8 *)
             ((long)&(__return_storage_ptr__->val).
                     super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>.
                     super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                     super__Variant_storage_alias<wasm::Type,_wasm::None,_wasm::Err> + 0x10);
    uVar7 = 0;
    elems.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)__return_storage_ptr__;
    do {
      bVar5 = Lexer::takeRParen(local_68);
      if (bVar5) {
        if (uVar7 < 2) {
          _val.val.super__Variant_base<wasm::Type,_wasm::Err>.
          super__Move_assign_alias<wasm::Type,_wasm::Err>.
          super__Copy_assign_alias<wasm::Type,_wasm::Err>.
          super__Move_ctor_alias<wasm::Type,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
          super__Variant_storage_alias<wasm::Type,_wasm::Err>._32_8_ = &local_d8;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)
                     ((long)&_val.val.super__Variant_base<wasm::Type,_wasm::Err>.
                             super__Move_assign_alias<wasm::Type,_wasm::Err>.
                             super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                             super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::Type,_wasm::Err> + 0x20),
                     "tuples must have at least two elements","");
          pTVar4 = elems.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
          Lexer::err((Err *)local_c8,local_68,
                     (string *)
                     ((long)&_val.val.super__Variant_base<wasm::Type,_wasm::Err>.
                             super__Move_assign_alias<wasm::Type,_wasm::Err>.
                             super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                             super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::Type,_wasm::Err> + 0x20));
          pTVar4->id = (uintptr_t)puVar1;
          _Var2._M_storage.id =
               (Type)((long)&elem.val.super__Variant_base<wasm::Type,_wasm::Err>.
                             super__Move_assign_alias<wasm::Type,_wasm::Err>.
                             super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                             super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::Type,_wasm::Err> + 8);
          if ((Type)local_c8 == _Var2._M_storage.id) {
            *puVar1 = CONCAT71(elem.val.super__Variant_base<wasm::Type,_wasm::Err>.
                               super__Move_assign_alias<wasm::Type,_wasm::Err>.
                               super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                               super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                               super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
                               super__Variant_storage_alias<wasm::Type,_wasm::Err>._M_u._9_7_,
                               elem.val.super__Variant_base<wasm::Type,_wasm::Err>.
                               super__Move_assign_alias<wasm::Type,_wasm::Err>.
                               super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                               super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                               super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
                               super__Variant_storage_alias<wasm::Type,_wasm::Err>._M_u._8_1_);
            *(undefined8 *)
             ((long)&(__return_storage_ptr__->val).
                     super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>.
                     super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                     super__Variant_storage_alias<wasm::Type,_wasm::None,_wasm::Err> + 0x18) =
                 elem.val.super__Variant_base<wasm::Type,_wasm::Err>.
                 super__Move_assign_alias<wasm::Type,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Type,_wasm::Err>._M_u._16_8_;
          }
          else {
            pTVar4->id = (uintptr_t)local_c8;
            pTVar4[2].id = CONCAT71(elem.val.super__Variant_base<wasm::Type,_wasm::Err>.
                                    super__Move_assign_alias<wasm::Type,_wasm::Err>.
                                    super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                                    super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                                    super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
                                    super__Variant_storage_alias<wasm::Type,_wasm::Err>._M_u._9_7_,
                                    elem.val.super__Variant_base<wasm::Type,_wasm::Err>.
                                    super__Move_assign_alias<wasm::Type,_wasm::Err>.
                                    super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                                    super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                                    super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
                                    super__Variant_storage_alias<wasm::Type,_wasm::Err>._M_u._8_1_);
          }
          pTVar4[1].id = (uintptr_t)
                         elem.val.super__Variant_base<wasm::Type,_wasm::Err>.
                         super__Move_assign_alias<wasm::Type,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
                         super__Variant_storage_alias<wasm::Type,_wasm::Err>._M_u._M_first.
                         _M_storage.id;
          elem.val.super__Variant_base<wasm::Type,_wasm::Err>.
          super__Move_assign_alias<wasm::Type,_wasm::Err>.
          super__Copy_assign_alias<wasm::Type,_wasm::Err>.
          super__Move_ctor_alias<wasm::Type,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
          super__Variant_storage_alias<wasm::Type,_wasm::Err>._M_u._M_first._M_storage.id =
               (_Uninitialized<wasm::Type,_true>)(Type)0x0;
          elem.val.super__Variant_base<wasm::Type,_wasm::Err>.
          super__Move_assign_alias<wasm::Type,_wasm::Err>.
          super__Copy_assign_alias<wasm::Type,_wasm::Err>.
          super__Move_ctor_alias<wasm::Type,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
          super__Variant_storage_alias<wasm::Type,_wasm::Err>._M_u._8_1_ = 0;
          *(undefined1 *)&pTVar4[4].id = 2;
          local_c8 = (undefined1  [8])_Var2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_val.val.super__Variant_base<wasm::Type,_wasm::Err>.
                 super__Move_assign_alias<wasm::Type,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Type,_wasm::Err>._32_8_ == &local_d8) break;
          uVar7 = local_d8._M_allocated_capacity + 1;
          elem.val.super__Variant_base<wasm::Type,_wasm::Err>.
          super__Move_assign_alias<wasm::Type,_wasm::Err>.
          super__Copy_assign_alias<wasm::Type,_wasm::Err>.
          super__Move_ctor_alias<wasm::Type,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
          super__Variant_storage_alias<wasm::Type,_wasm::Err>._32_8_ =
               _val.val.super__Variant_base<wasm::Type,_wasm::Err>.
               super__Move_assign_alias<wasm::Type,_wasm::Err>.
               super__Copy_assign_alias<wasm::Type,_wasm::Err>.
               super__Move_ctor_alias<wasm::Type,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
               super__Variant_storage_alias<wasm::Type,_wasm::Err>._32_8_;
        }
        else {
          std::vector<wasm::Type,_std::allocator<wasm::Type>_>::vector
                    ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)
                     ((long)&elem.val.super__Variant_base<wasm::Type,_wasm::Err>.
                             super__Move_assign_alias<wasm::Type,_wasm::Err>.
                             super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                             super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::Type,_wasm::Err> + 0x20),
                     (vector<wasm::Type,_std::allocator<wasm::Type>_> *)auStack_58);
          pTVar4 = elems.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
          TVar6 = TypeBuilder::getTempTupleType
                            (local_60->builder,
                             (Tuple *)((long)&elem.val.super__Variant_base<wasm::Type,_wasm::Err>.
                                              super__Move_assign_alias<wasm::Type,_wasm::Err>.
                                              super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                                              super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                                              super__Copy_ctor_alias<wasm::Type,_wasm::Err> + 0x20))
          ;
          pTVar4->id = (uintptr_t)TVar6;
          *(undefined1 *)&pTVar4[4].id = 0;
          if (elem.val.super__Variant_base<wasm::Type,_wasm::Err>.
              super__Move_assign_alias<wasm::Type,_wasm::Err>.
              super__Copy_assign_alias<wasm::Type,_wasm::Err>.
              super__Move_ctor_alias<wasm::Type,_wasm::Err>.
              super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
              super__Variant_storage_alias<wasm::Type,_wasm::Err>._32_8_ == 0) break;
          uVar7 = local_90 -
                  elem.val.super__Variant_base<wasm::Type,_wasm::Err>.
                  super__Move_assign_alias<wasm::Type,_wasm::Err>.
                  super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                  super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                  super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
                  super__Variant_storage_alias<wasm::Type,_wasm::Err>._32_8_;
        }
        operator_delete((void *)elem.val.super__Variant_base<wasm::Type,_wasm::Err>.
                                super__Move_assign_alias<wasm::Type,_wasm::Err>.
                                super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                                super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                                super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
                                super__Variant_storage_alias<wasm::Type,_wasm::Err>._32_8_,uVar7);
        break;
      }
      singlevaltype<wasm::WATParser::ParseTypeDefsCtx>((Result<wasm::Type> *)local_c8,local_60);
      std::__detail::__variant::_Copy_ctor_base<false,_wasm::Type,_wasm::Err>::_Copy_ctor_base
                ((_Copy_ctor_base<false,_wasm::Type,_wasm::Err> *)local_110,
                 (_Copy_ctor_base<false,_wasm::Type,_wasm::Err> *)local_c8);
      uVar3 = _val.val.super__Variant_base<wasm::Type,_wasm::Err>.
              super__Move_assign_alias<wasm::Type,_wasm::Err>.
              super__Copy_assign_alias<wasm::Type,_wasm::Err>.
              super__Move_ctor_alias<wasm::Type,_wasm::Err>.
              super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
              super__Variant_storage_alias<wasm::Type,_wasm::Err>._M_u._24_1_;
      if (_val.val.super__Variant_base<wasm::Type,_wasm::Err>.
          super__Move_assign_alias<wasm::Type,_wasm::Err>.
          super__Copy_assign_alias<wasm::Type,_wasm::Err>.
          super__Move_ctor_alias<wasm::Type,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
          super__Variant_storage_alias<wasm::Type,_wasm::Err>._M_u._24_1_ == '\x01') {
        local_88 = &local_78;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_88,local_110,
                   (undefined1 *)
                   ((long)_val.val.super__Variant_base<wasm::Type,_wasm::Err>.
                          super__Move_assign_alias<wasm::Type,_wasm::Err>.
                          super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                          super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                          super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
                          super__Variant_storage_alias<wasm::Type,_wasm::Err>._M_u._M_first.
                          _M_storage.id + (long)local_110));
        (elems.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage)->id = (uintptr_t)puVar1;
        if (local_88 == &local_78) {
          *puVar1 = CONCAT71(uStack_77,local_78);
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->val).
                   super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>.
                   super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Type,_wasm::None,_wasm::Err> + 0x18) =
               uStack_70;
        }
        else {
          (elems.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage)->id = (uintptr_t)local_88;
          elems.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage[2].id = CONCAT71(uStack_77,local_78);
        }
        elems.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage[1].id = local_80;
        local_80 = 0;
        local_78 = 0;
        *(undefined1 *)
         &elems.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage[4].id = 2;
        local_88 = &local_78;
        std::__detail::__variant::_Variant_storage<false,_wasm::Type,_wasm::Err>::~_Variant_storage
                  ((_Variant_storage<false,_wasm::Type,_wasm::Err> *)local_110);
      }
      else {
        std::__detail::__variant::_Variant_storage<false,_wasm::Type,_wasm::Err>::~_Variant_storage
                  ((_Variant_storage<false,_wasm::Type,_wasm::Err> *)local_110);
        local_110 = local_c8;
        if (elems.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
            super__Vector_impl_data._M_start ==
            elems.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          std::vector<wasm::Type,std::allocator<wasm::Type>>::_M_realloc_insert<wasm::Type_const&>
                    ((vector<wasm::Type,std::allocator<wasm::Type>> *)auStack_58,
                     (iterator)
                     elems.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                     super__Vector_impl_data._M_start,(Type *)local_110);
        }
        else {
          (elems.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
           super__Vector_impl_data._M_start)->id = (uintptr_t)local_c8;
          elems.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
          super__Vector_impl_data._M_start =
               elems.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
               super__Vector_impl_data._M_start + 1;
        }
        uVar7 = uVar7 + 1;
      }
      std::__detail::__variant::_Variant_storage<false,_wasm::Type,_wasm::Err>::~_Variant_storage
                ((_Variant_storage<false,_wasm::Type,_wasm::Err> *)local_c8);
    } while (uVar3 != '\x01');
    __return_storage_ptr__ =
         (MaybeResult<wasm::Type> *)
         elems.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    if (auStack_58 != (undefined1  [8])0x0) {
      operator_delete((void *)auStack_58,
                      (long)elems.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)auStack_58);
      __return_storage_ptr__ =
           (MaybeResult<wasm::Type> *)
           elems.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
    }
  }
  else {
    *(__index_type *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>.
             super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
             super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
             super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
             super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
             super__Variant_storage_alias<wasm::Type,_wasm::None,_wasm::Err> + 0x20) = '\x01';
  }
  return __return_storage_ptr__;
}

Assistant:

MaybeResult<typename Ctx::TypeT> tupletype(Ctx& ctx) {
  if (!ctx.in.takeSExprStart("tuple"sv)) {
    return {};
  }
  auto elems = ctx.makeTupleElemList();
  size_t numElems = 0;
  while (!ctx.in.takeRParen()) {
    auto elem = singlevaltype(ctx);
    CHECK_ERR(elem);
    ctx.appendTupleElem(elems, *elem);
    ++numElems;
  }
  if (numElems < 2) {
    return ctx.in.err("tuples must have at least two elements");
  }
  return ctx.makeTupleType(elems);
}